

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

shared_ptr<Pipeline> __thiscall QPDFLogger::getError(QPDFLogger *this,bool null_okay)

{
  element_type *peVar1;
  byte in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  shared_ptr<Pipeline> sVar2;
  shared_ptr<Pipeline> local_30;
  byte local_19;
  __shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  bool null_okay_local;
  QPDFLogger *this_local;
  
  this_00 = (__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            CONCAT71(in_register_00000031,null_okay);
  local_19 = in_DL & 1;
  p_Stack_18 = this_00;
  this_local = this;
  peVar1 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  std::shared_ptr<Pipeline>::shared_ptr(&local_30,&peVar1->p_error);
  throwIfNull(this,(shared_ptr<Pipeline> *)this_00,SUB81(&local_30,0));
  std::shared_ptr<Pipeline>::~shared_ptr(&local_30);
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::getError(bool null_okay)
{
    return throwIfNull(m->p_error, null_okay);
}